

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Content.h
# Opt level: O0

string * __thiscall
ZXing::SymbologyIdentifier::toString_abi_cxx11_(SymbologyIdentifier *this,bool hasECI)

{
  char cVar1;
  byte in_DL;
  char *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *psVar2;
  undefined2 in_stack_ffffffffffffff90;
  byte bVar3;
  byte bVar4;
  undefined4 in_stack_ffffffffffffff94;
  bool local_5a;
  undefined1 local_59 [33];
  string local_38 [39];
  byte local_11;
  
  local_11 = in_DL & 1;
  cVar1 = *in_RSI;
  bVar4 = 0;
  bVar3 = 0;
  if (cVar1 == '\0') {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_59;
    psVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff94,
                        CONCAT13(bVar4,CONCAT12(bVar3,in_stack_ffffffffffffff90))),(size_type)in_RSI
               ,(char)((ulong)psVar2 >> 0x38),(allocator<char> *)in_RDI);
    bVar4 = 1;
    std::operator+((char)((ulong)in_RDI >> 0x38),__rhs);
    bVar3 = 1;
    std::operator+(in_RDI,(char)((ulong)__rhs >> 0x38));
    in_RDI = psVar2;
  }
  local_5a = cVar1 != '\0';
  if ((bVar3 & 1) != 0) {
    std::__cxx11::string::~string(local_38);
  }
  if ((bVar4 & 1) != 0) {
    std::__cxx11::string::~string((string *)(local_59 + 1));
  }
  if (local_5a) {
    std::allocator<char>::~allocator((allocator<char> *)local_59);
  }
  return in_RDI;
}

Assistant:

std::string toString(bool hasECI = false) const
	{
		return code ? ']' + std::string(1, code) + static_cast<char>(modifier + eciModifierOffset * hasECI) : std::string();
	}